

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O3

string * __thiscall
ElectricityBill::DoQuery_abi_cxx11_
          (string *__return_storage_ptr__,ElectricityBill *this,RoomInfo *room_info)

{
  pointer pcVar1;
  size_type in_R8;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"sh","");
  std::operator+(&local_b0,&this->text_root_,&SH_FILE_abi_cxx11_);
  local_90[0] = local_80;
  pcVar1 = (room_info->flatname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + (room_info->flatname)._M_string_length);
  plVar2 = local_60;
  pcVar1 = (room_info->roomname)._M_dataplus._M_p;
  local_70[0] = plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (room_info->roomname)._M_string_length);
  args._M_len = in_R8;
  args._M_array = (iterator)0x3;
  higan::System::RunShellCommand(__return_storage_ptr__,(System *)local_50,&local_b0,args);
  lVar3 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ElectricityBill::DoQuery(const RoomInfo& room_info)
{
	return higan::System::RunShellCommand("sh",
			{text_root_ + SH_FILE, room_info.flatname, room_info.roomname});
}